

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  string asStack_3e8 [32];
  stringstream ss;
  ostream local_3b8 [376];
  fstream in;
  
  core_initialization();
  std::fstream::fstream(&in);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<(local_3b8,argv[lVar2]);
    std::operator<<(poVar1," ");
  }
  core_query(&ss);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,asStack_3e8);
  std::__cxx11::string::~string(asStack_3e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::fstream::~fstream(&in);
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
    core_initialization();
    fstream in;
    stringstream ss;

    #ifdef DEBUG
        string str;
        in.open("query.txt",ios::in);
        while(in.good()){
            in>>str;
            ss<<str<<" ";
        }
    #else
        for(int i=1;i<argc;i++)
            ss<<argv[i]<<" ";
    #endif

    cout<<core_query(ss).str();

    #ifdef WINDOWS
        system("pause");
    #endif
    return 0;
}